

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O3

bool __thiscall cmCTestUploadCommand::CheckArgumentValue(cmCTestUploadCommand *this,string *arg)

{
  int iVar1;
  cmMakefile *this_00;
  bool bVar2;
  ostream *poVar3;
  ostringstream e;
  string local_1b0;
  undefined1 local_190 [376];
  
  iVar1 = (this->super_cmCTestHandlerCommand).ArgumentDoing;
  if (iVar1 == 3) {
    bVar2 = cmsys::SystemTools::FileExists((arg->_M_dataplus)._M_p);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"File \"",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(arg->_M_dataplus)._M_p,arg->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" does not exist. Cannot submit ",0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a non-existent file.",0x14);
      this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
      return false;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->Files,arg);
  }
  else {
    if (iVar1 != 4) {
      bVar2 = cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
      return bVar2;
    }
    (this->super_cmCTestHandlerCommand).Values.
    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (arg->_M_dataplus)._M_p;
  }
  return true;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentValue(std::string const& arg)
{
  if (this->ArgumentDoing == ArgumentDoingCaptureCMakeError) {
    this->Values[ct_CAPTURE_CMAKE_ERROR] = arg.c_str();
    return true;
  }
  if (this->ArgumentDoing == ArgumentDoingFiles) {
    if (cmSystemTools::FileExists(arg.c_str())) {
      this->Files.insert(arg);
      return true;
    }
    std::ostringstream e;
    e << "File \"" << arg << "\" does not exist. Cannot submit "
      << "a non-existent file.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    this->ArgumentDoing = ArgumentDoingError;
    return false;
  }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}